

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O3

void __thiscall
Assimp::ColladaLoader::InternReadFile
          (ColladaLoader *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  pointer ppaVar12;
  pointer ppVar13;
  pointer ppaVar14;
  pointer ppaVar15;
  pointer ppaVar16;
  pointer ppaVar17;
  _Base_ptr __n;
  _Rb_tree_color _Var18;
  aiNode *paVar19;
  aiMetadata *paVar20;
  aiString *paVar21;
  aiMetadataEntry *__s;
  _Rb_tree_color *p_Var22;
  _Base_ptr p_Var23;
  runtime_error *this_00;
  aiScene *extraout_RDX;
  aiScene *extraout_RDX_00;
  uint uVar24;
  aiString *paVar25;
  ulong uVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  SkeletonMeshBuilder hero;
  ColladaParser parser;
  undefined1 local_398 [24];
  pointer local_380;
  pointer local_370;
  pointer local_368;
  pointer local_358;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  ColladaParser local_318;
  
  std::__cxx11::string::_M_assign((string *)&this->mFileName);
  std::
  _Rb_tree<Assimp::ColladaMeshIndex,_std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>,_std::_Select1st<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>,_std::less<Assimp::ColladaMeshIndex>,_std::allocator<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>_>
  ::clear(&(this->mMeshIndexByID)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::clear(&(this->mMaterialIndexByName)._M_t);
  ppaVar12 = (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar12) {
    (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar12;
  }
  ppaVar12 = (this->mTargetMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->mTargetMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar12) {
    (this->mTargetMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar12;
  }
  ppVar13 = (this->newMats).
            super__Vector_base<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->newMats).
      super__Vector_base<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar13) {
    (this->newMats).
    super__Vector_base<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar13;
  }
  ppaVar14 = (this->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar14) {
    (this->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar14;
  }
  ppaVar15 = (this->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar15) {
    (this->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar15;
  }
  ppaVar16 = (this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  if ((this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar16) {
    (this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar16;
  }
  ppaVar17 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar17) {
    (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar17;
  }
  ColladaParser::ColladaParser(&local_318,pIOHandler,pFile);
  if (local_318.mRootNode != (Node *)0x0) {
    std::
    vector<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
    ::reserve(&this->newMats,
              local_318.mMaterialLibrary._M_t._M_impl.super__Rb_tree_header._M_node_count * 2);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
              (&this->mMeshes,
               local_318.mMeshLibrary._M_t._M_impl.super__Rb_tree_header._M_node_count * 2);
    std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::reserve
              (&this->mCameras,
               local_318.mCameraLibrary._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::vector<aiLight_*,_std::allocator<aiLight_*>_>::reserve
              (&this->mLights,
               local_318.mLightLibrary._M_t._M_impl.super__Rb_tree_header._M_node_count);
    BuildMaterials(this,&local_318,extraout_RDX);
    paVar19 = BuildHierarchy(this,&local_318,local_318.mRootNode);
    pScene->mRootNode = paVar19;
    FillMaterials(this,&local_318,extraout_RDX_00);
    paVar19 = pScene->mRootNode;
    fVar27 = (paVar19->mTransformation).a1;
    fVar28 = (paVar19->mTransformation).a3;
    fVar39 = (paVar19->mTransformation).a4;
    fVar45 = (paVar19->mTransformation).b1;
    fVar1 = (paVar19->mTransformation).b3;
    fVar2 = (paVar19->mTransformation).b4;
    fVar3 = (paVar19->mTransformation).c1;
    fVar4 = (paVar19->mTransformation).c3;
    fVar5 = (paVar19->mTransformation).c4;
    fVar6 = (paVar19->mTransformation).d1;
    fVar42 = (paVar19->mTransformation).a2;
    fVar44 = fVar42 * 0.0;
    fVar46 = fVar27 * 0.0 + fVar44;
    fVar34 = fVar28 * 0.0;
    fVar7 = (paVar19->mTransformation).d3;
    fVar36 = fVar39 * 0.0;
    fVar8 = (paVar19->mTransformation).d4;
    fVar9 = (paVar19->mTransformation).b2;
    fVar10 = (paVar19->mTransformation).c2;
    fVar11 = (paVar19->mTransformation).d2;
    (paVar19->mTransformation).a1 = fVar36 + fVar34 + fVar27 * local_318.mUnitSize + fVar44;
    (paVar19->mTransformation).a2 = fVar36 + fVar34 + fVar27 * 0.0 + fVar42 * local_318.mUnitSize;
    (paVar19->mTransformation).a3 = local_318.mUnitSize * fVar28 + fVar46 + fVar36;
    (paVar19->mTransformation).a4 = fVar46 + fVar34 + fVar39;
    fVar27 = fVar9 * 0.0;
    fVar39 = fVar45 * 0.0 + fVar27;
    fVar42 = fVar1 * 0.0;
    fVar28 = fVar2 * 0.0;
    (paVar19->mTransformation).b1 = fVar28 + fVar42 + fVar45 * local_318.mUnitSize + fVar27;
    (paVar19->mTransformation).b2 = fVar28 + fVar42 + fVar45 * 0.0 + fVar9 * local_318.mUnitSize;
    (paVar19->mTransformation).b3 = local_318.mUnitSize * fVar1 + fVar39 + fVar28;
    (paVar19->mTransformation).b4 = fVar39 + fVar42 + fVar2;
    fVar45 = fVar10 * 0.0;
    fVar28 = fVar3 * 0.0 + fVar45;
    fVar39 = fVar4 * 0.0;
    fVar27 = fVar5 * 0.0;
    (paVar19->mTransformation).c1 = fVar27 + fVar39 + fVar3 * local_318.mUnitSize + fVar45;
    (paVar19->mTransformation).c2 = fVar27 + fVar39 + fVar3 * 0.0 + fVar10 * local_318.mUnitSize;
    (paVar19->mTransformation).c3 = local_318.mUnitSize * fVar4 + fVar28 + fVar27;
    (paVar19->mTransformation).c4 = fVar28 + fVar39 + fVar5;
    fVar45 = fVar11 * 0.0;
    fVar28 = fVar6 * 0.0 + fVar45;
    fVar39 = fVar7 * 0.0;
    fVar27 = fVar8 * 0.0;
    (paVar19->mTransformation).d1 = fVar27 + fVar39 + fVar6 * local_318.mUnitSize + fVar45;
    (paVar19->mTransformation).d2 = fVar27 + fVar39 + fVar6 * 0.0 + fVar11 * local_318.mUnitSize;
    (paVar19->mTransformation).d3 = local_318.mUnitSize * fVar7 + fVar28 + fVar27;
    (paVar19->mTransformation).d4 = fVar28 + fVar39 + fVar8;
    if (this->ignoreUpDirection == false) {
      if (local_318.mUpDirection == UP_Z) {
        paVar19 = pScene->mRootNode;
        fVar27 = (paVar19->mTransformation).a1;
        fVar28 = (paVar19->mTransformation).a2;
        fVar29 = fVar28 * 0.0;
        fVar39 = (paVar19->mTransformation).a3;
        fVar45 = (paVar19->mTransformation).a4;
        fVar34 = fVar27 * 0.0;
        fVar30 = fVar29 + fVar34;
        fVar1 = (paVar19->mTransformation).b1;
        fVar2 = (paVar19->mTransformation).b2;
        fVar31 = fVar2 * 0.0;
        fVar43 = fVar1 * 0.0;
        fVar32 = fVar31 + fVar43;
        fVar3 = (paVar19->mTransformation).c1;
        fVar4 = (paVar19->mTransformation).c2;
        fVar33 = fVar4 * 0.0;
        fVar41 = fVar3 * 0.0;
        fVar35 = fVar33 + fVar41;
        fVar5 = (paVar19->mTransformation).d1;
        fVar6 = (paVar19->mTransformation).d2;
        fVar37 = fVar6 * 0.0;
        fVar40 = fVar5 * 0.0;
        fVar38 = fVar37 + fVar40;
        fVar47 = fVar45 * 0.0;
        fVar42 = (paVar19->mTransformation).b3;
        fVar7 = (paVar19->mTransformation).b4;
        fVar36 = fVar7 * 0.0;
        fVar8 = (paVar19->mTransformation).c3;
        fVar9 = (paVar19->mTransformation).c4;
        fVar44 = fVar9 * 0.0;
        fVar10 = (paVar19->mTransformation).d3;
        fVar11 = (paVar19->mTransformation).d4;
        fVar46 = fVar11 * 0.0;
        (paVar19->mTransformation).a1 = fVar47 + fVar39 * 0.0 + fVar27 + fVar29;
        (paVar19->mTransformation).a2 = fVar47 + fVar39 * -1.0 + fVar30;
        (paVar19->mTransformation).a3 = fVar34 + fVar28 + fVar39 * 0.0 + fVar47;
        (paVar19->mTransformation).a4 = fVar39 * 0.0 + fVar30 + fVar45;
        (paVar19->mTransformation).b1 = fVar36 + fVar42 * 0.0 + fVar1 + fVar31;
        (paVar19->mTransformation).b2 = fVar36 + fVar42 * -1.0 + fVar32;
        (paVar19->mTransformation).b3 = fVar43 + fVar2 + fVar42 * 0.0 + fVar36;
        (paVar19->mTransformation).b4 = fVar42 * 0.0 + fVar32 + fVar7;
        (paVar19->mTransformation).c1 = fVar44 + fVar8 * 0.0 + fVar3 + fVar33;
        (paVar19->mTransformation).c2 = fVar44 + fVar8 * -1.0 + fVar35;
        (paVar19->mTransformation).c3 = fVar41 + fVar4 + fVar8 * 0.0 + fVar44;
        (paVar19->mTransformation).c4 = fVar8 * 0.0 + fVar35 + fVar9;
        (paVar19->mTransformation).d1 = fVar46 + fVar10 * 0.0 + fVar5 + fVar37;
        (paVar19->mTransformation).d2 = fVar46 + fVar10 * -1.0 + fVar38;
        (paVar19->mTransformation).d3 = fVar40 + fVar6 + fVar10 * 0.0 + fVar46;
        (paVar19->mTransformation).d4 = fVar10 * 0.0 + fVar38 + fVar11;
      }
      else if (local_318.mUpDirection == UP_X) {
        paVar19 = pScene->mRootNode;
        fVar27 = (paVar19->mTransformation).a1;
        fVar28 = (paVar19->mTransformation).a2;
        fVar39 = (paVar19->mTransformation).a3;
        fVar45 = (paVar19->mTransformation).a4;
        fVar34 = fVar28 * 0.0;
        fVar43 = fVar27 * 0.0 + fVar34;
        fVar40 = fVar39 * 0.0;
        fVar33 = fVar45 * 0.0;
        fVar1 = (paVar19->mTransformation).b1;
        fVar2 = (paVar19->mTransformation).b2;
        fVar3 = (paVar19->mTransformation).b3;
        fVar4 = (paVar19->mTransformation).b4;
        fVar36 = fVar2 * 0.0;
        fVar31 = fVar1 * 0.0 + fVar36;
        fVar37 = fVar3 * 0.0;
        fVar32 = fVar4 * 0.0;
        fVar5 = (paVar19->mTransformation).c2;
        fVar44 = fVar5 * 0.0;
        local_328 = ZEXT416((uint)fVar44);
        fVar6 = (paVar19->mTransformation).c1;
        fVar35 = fVar6 * 0.0 + fVar44;
        fVar42 = (paVar19->mTransformation).c3;
        fVar47 = fVar42 * 0.0;
        fVar7 = (paVar19->mTransformation).c4;
        fVar30 = fVar7 * 0.0;
        fVar8 = (paVar19->mTransformation).d2;
        local_338 = ZEXT416((uint)fVar8);
        fVar46 = fVar8 * 0.0;
        local_348 = ZEXT416((uint)fVar46);
        fVar9 = (paVar19->mTransformation).d1;
        fVar41 = fVar9 * 0.0 + fVar46;
        fVar10 = (paVar19->mTransformation).d3;
        fVar38 = fVar10 * 0.0;
        fVar11 = (paVar19->mTransformation).d4;
        fVar29 = fVar11 * 0.0;
        (paVar19->mTransformation).a1 = fVar33 + fVar40 + fVar27 * 0.0 + fVar28;
        (paVar19->mTransformation).a2 = fVar33 + fVar40 + fVar27 * -1.0 + fVar34;
        (paVar19->mTransformation).a3 = fVar39 + fVar43 + fVar33;
        (paVar19->mTransformation).a4 = fVar43 + fVar40 + fVar45;
        (paVar19->mTransformation).b1 = fVar32 + fVar37 + fVar1 * 0.0 + fVar2;
        (paVar19->mTransformation).b2 = fVar32 + fVar37 + fVar1 * -1.0 + fVar36;
        (paVar19->mTransformation).b3 = fVar3 + fVar31 + fVar32;
        (paVar19->mTransformation).b4 = fVar31 + fVar37 + fVar4;
        (paVar19->mTransformation).c1 = fVar30 + fVar47 + fVar6 * 0.0 + fVar5;
        (paVar19->mTransformation).c2 = fVar30 + fVar47 + fVar6 * -1.0 + fVar44;
        (paVar19->mTransformation).c3 = fVar42 + fVar35 + fVar30;
        (paVar19->mTransformation).c4 = fVar35 + fVar47 + fVar7;
        (paVar19->mTransformation).d1 = fVar29 + fVar38 + fVar9 * 0.0 + fVar8;
        (paVar19->mTransformation).d2 = fVar29 + fVar38 + fVar9 * -1.0 + fVar46;
        (paVar19->mTransformation).d3 = fVar10 + fVar41 + fVar29;
        (paVar19->mTransformation).d4 = fVar41 + fVar38 + fVar11;
      }
    }
    if (local_318.mAssetMetaData._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      if ((uint)local_318.mAssetMetaData._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        paVar20 = (aiMetadata *)0x0;
      }
      else {
        paVar20 = (aiMetadata *)operator_new(0x18);
        paVar20->mNumProperties =
             (uint)local_318.mAssetMetaData._M_t._M_impl.super__Rb_tree_header._M_node_count;
        uVar26 = local_318.mAssetMetaData._M_t._M_impl.super__Rb_tree_header._M_node_count &
                 0xffffffff;
        paVar21 = (aiString *)operator_new__(uVar26 * 0x404);
        paVar25 = paVar21;
        do {
          paVar25->length = 0;
          paVar25->data[0] = '\0';
          memset(paVar25->data + 1,0x1b,0x3ff);
          paVar25 = paVar25 + 1;
        } while (paVar25 != paVar21 + uVar26);
        paVar20->mKeys = paVar21;
        __s = (aiMetadataEntry *)operator_new__(uVar26 << 4);
        memset(__s,0,uVar26 << 4);
        paVar20->mValues = __s;
      }
      pScene->mMetaData = paVar20;
      if ((_Rb_tree_header *)
          local_318.mAssetMetaData._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_318.mAssetMetaData._M_t._M_impl.super__Rb_tree_header) {
        uVar24 = 0;
        p_Var23 = local_318.mAssetMetaData._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          paVar20 = pScene->mMetaData;
          if ((uVar24 < paVar20->mNumProperties) &&
             (__n = p_Var23[1]._M_parent, __n != (_Base_ptr)0x0)) {
            if (__n < (_Base_ptr)0x400) {
              paVar21 = paVar20->mKeys;
              paVar25 = paVar21 + uVar24;
              paVar25->length = (ai_uint32)__n;
              memcpy(paVar25->data,*(void **)(p_Var23 + 1),(size_t)__n);
              (&__n->field_0x4)[(long)(paVar21 + uVar24)] = 0;
            }
            paVar20->mValues[uVar24].mType = AI_AISTRING;
            p_Var22 = (_Rb_tree_color *)operator_new(0x404);
            _Var18 = p_Var23[2]._M_color;
            if (0x3fe < p_Var23[2]._M_color) {
              _Var18 = 0x3ff;
            }
            *p_Var22 = _Var18;
            memcpy(p_Var22 + 1,&p_Var23[2].field_0x4,(ulong)_Var18);
            *(undefined1 *)((long)p_Var22 + (ulong)_Var18 + 4) = 0;
            paVar20->mValues[uVar24].mData = p_Var22;
          }
          p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
          uVar24 = uVar24 + 1;
        } while ((_Rb_tree_header *)p_Var23 !=
                 &local_318.mAssetMetaData._M_t._M_impl.super__Rb_tree_header);
      }
    }
    StoreSceneMeshes(this,pScene);
    StoreSceneMaterials(this,pScene);
    StoreSceneTextures(this,pScene);
    StoreSceneLights(this,pScene);
    StoreSceneCameras(this,pScene);
    StoreAnimations(this,pScene,&local_318);
    if (pScene->mNumMeshes == 0) {
      if (this->noSkeletonMesh == false) {
        SkeletonMeshBuilder::SkeletonMeshBuilder
                  ((SkeletonMeshBuilder *)local_398,pScene,(aiNode *)0x0,false);
        if (local_368 != (pointer)0x0) {
          operator_delete(local_368,(long)local_358 - (long)local_368);
        }
        if (local_380 != (pointer)0x0) {
          operator_delete(local_380,(long)local_370 - (long)local_380);
        }
        if ((pointer)local_398._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_398._0_8_,local_398._16_8_ - local_398._0_8_);
        }
      }
      *(byte *)&pScene->mFlags = (byte)pScene->mFlags | 1;
    }
    ColladaParser::~ColladaParser(&local_318);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_398._0_8_ = local_398 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_398,"Collada: File came out empty. Something is wrong here.","");
  std::runtime_error::runtime_error(this_00,(string *)local_398);
  *(undefined ***)this_00 = &PTR__runtime_error_0080bf48;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ColladaLoader::InternReadFile(const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler) {
    mFileName = pFile;

    // clean all member arrays - just for safety, it should work even if we did not
    mMeshIndexByID.clear();
    mMaterialIndexByName.clear();
    mMeshes.clear();
    mTargetMeshes.clear();
    newMats.clear();
    mLights.clear();
    mCameras.clear();
    mTextures.clear();
    mAnims.clear();

    // parse the input file
    ColladaParser parser(pIOHandler, pFile);


    if( !parser.mRootNode) {
        throw DeadlyImportError( "Collada: File came out empty. Something is wrong here.");
    }

    // reserve some storage to avoid unnecessary reallocs
    newMats.reserve(parser.mMaterialLibrary.size()*2u);
    mMeshes.reserve(parser.mMeshLibrary.size()*2u);

    mCameras.reserve(parser.mCameraLibrary.size());
    mLights.reserve(parser.mLightLibrary.size());

    // create the materials first, for the meshes to find
    BuildMaterials(parser, pScene);

    // build the node hierarchy from it
    pScene->mRootNode = BuildHierarchy(parser, parser.mRootNode);

    // ... then fill the materials with the now adjusted settings
    FillMaterials(parser, pScene);

    // Apply unit-size scale calculation

    pScene->mRootNode->mTransformation *= aiMatrix4x4(parser.mUnitSize, 0,  0,  0,
                                                        0,  parser.mUnitSize,  0,  0,
                                                        0,  0,  parser.mUnitSize,  0,
                                                        0,  0,  0,  1);
    if( !ignoreUpDirection ) {
        // Convert to Y_UP, if different orientation
        if( parser.mUpDirection == ColladaParser::UP_X) {
            pScene->mRootNode->mTransformation *= aiMatrix4x4(
                    0, -1,  0,  0,
                    1,  0,  0,  0,
                    0,  0,  1,  0,
                    0,  0,  0,  1);
        } else if( parser.mUpDirection == ColladaParser::UP_Z) {
            pScene->mRootNode->mTransformation *= aiMatrix4x4(
                    1,  0,  0,  0,
                    0,  0,  1,  0,
                    0, -1,  0,  0,
                    0,  0,  0,  1);
        }
    }

    // Store scene metadata
    if (!parser.mAssetMetaData.empty()) {
        const size_t numMeta(parser.mAssetMetaData.size());
        pScene->mMetaData = aiMetadata::Alloc(static_cast<unsigned int>(numMeta));
        size_t i = 0;
        for (auto it = parser.mAssetMetaData.cbegin(); it != parser.mAssetMetaData.cend(); ++it, ++i) {
            pScene->mMetaData->Set(static_cast<unsigned int>(i), (*it).first, (*it).second);
        }
    }

    // store all meshes
    StoreSceneMeshes(pScene);

    // store all materials
    StoreSceneMaterials(pScene);

    // store all textures
    StoreSceneTextures(pScene);

    // store all lights
    StoreSceneLights(pScene);

    // store all cameras
    StoreSceneCameras(pScene);

    // store all animations
    StoreAnimations(pScene, parser);

    // If no meshes have been loaded, it's probably just an animated skeleton.
    if ( 0u == pScene->mNumMeshes) {

        if (!noSkeletonMesh) {
            SkeletonMeshBuilder hero(pScene);
        }
        pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
    }
}